

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_io.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> *
draco::ReadPointCloudFromFile
          (StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
           *__return_storage_ptr__,string *file_name)

{
  _Rb_tree_header *this;
  bool bVar1;
  PointCloud *this_00;
  DecoderBuffer decoder_buffer;
  vector<char,_std::allocator<char>_> buffer;
  string extension;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> status_or;
  Decoder decoder;
  
  this_00 = (PointCloud *)operator_new(0xa8);
  PointCloud::PointCloud(this_00);
  if (file_name->_M_string_length < 4) {
    std::__cxx11::string::string((string *)&decoder,(string *)file_name);
  }
  else {
    std::__cxx11::string::substr((ulong)&decoder,(ulong)file_name);
  }
  parser::ToLower(&extension,(string *)&decoder);
  std::__cxx11::string::~string((string *)&decoder);
  bVar1 = std::operator==(&extension,".obj");
  if (bVar1) {
    ObjDecoder::ObjDecoder((ObjDecoder *)&decoder);
    ObjDecoder::DecodeFromFile((Status *)&decoder_buffer,(ObjDecoder *)&decoder,file_name,this_00);
    if ((int)decoder_buffer.data_ == 0) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
      super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
      super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = this_00;
      this_00 = (PointCloud *)0x0;
    }
    else {
      StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)&decoder_buffer);
    }
    std::__cxx11::string::~string((string *)&decoder_buffer.data_size_);
    ObjDecoder::~ObjDecoder((ObjDecoder *)&decoder);
  }
  else {
    bVar1 = std::operator==(&extension,".ply");
    if (bVar1) {
      PlyDecoder::PlyDecoder((PlyDecoder *)&decoder);
      PlyDecoder::DecodeFromFile((Status *)&decoder_buffer,(PlyDecoder *)&decoder,file_name,this_00)
      ;
      if ((int)decoder_buffer.data_ == 0) {
        std::__cxx11::string::~string((string *)&decoder_buffer.data_size_);
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = this_00;
        this_00 = (PointCloud *)0x0;
      }
      else {
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr(__return_storage_ptr__,(Status *)&decoder_buffer);
        std::__cxx11::string::~string((string *)&decoder_buffer.data_size_);
      }
      DecoderBuffer::BitDecoder::~BitDecoder
                ((BitDecoder *)
                 &decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left);
    }
    else {
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar1 = ReadFileToBuffer(file_name,&buffer);
      if (bVar1) {
        DecoderBuffer::DecoderBuffer(&decoder_buffer);
        DecoderBuffer::Init(&decoder_buffer,
                            buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left = &decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header.
                   _M_header;
        decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = _S_red;
        decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_parent = (_Base_ptr)0x0;
        decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             0;
        decoder.options_.attribute_options_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &decoder.options_.attribute_options_._M_t._M_impl.super__Rb_tree_header._M_header;
        decoder.options_.attribute_options_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        decoder.options_.attribute_options_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        decoder.options_.attribute_options_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_right = decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header.
                   _M_header._M_left;
        decoder.options_.attribute_options_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             decoder.options_.attribute_options_._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
        Decoder::DecodePointCloudFromBuffer(&status_or,&decoder,&decoder_buffer);
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl =
             (PointCloud *)
             status_or.value_._M_t.
             super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
             super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
             super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl;
        status_or.value_._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::PointCloud,_std::default_delete<draco::PointCloud>,_true,_true>
             )(__uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>)0x0;
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        ~StatusOr(&status_or);
        DracoOptions<draco::GeometryAttribute::Type>::~DracoOptions(&decoder.options_);
        DecoderBuffer::BitDecoder::~BitDecoder(&decoder_buffer.bit_decoder_);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&decoder_buffer,"Unable to read input file.",
                   (allocator<char> *)&status_or);
        this = &decoder.options_.global_options_.options_._M_t._M_impl.super__Rb_tree_header;
        decoder.options_.global_options_.options_._M_t._M_impl._0_4_ = 0xffffffff;
        std::__cxx11::string::string((string *)this,(string *)&decoder_buffer);
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr(__return_storage_ptr__,(Status *)&decoder);
        std::__cxx11::string::~string((string *)this);
        std::__cxx11::string::~string((string *)&decoder_buffer);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buffer.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  if (this_00 != (PointCloud *)0x0) {
    (*this_00->_vptr_PointCloud[1])(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<PointCloud>> ReadPointCloudFromFile(
    const std::string &file_name) {
  std::unique_ptr<PointCloud> pc(new PointCloud());
  // Analyze file extension.
  const std::string extension = parser::ToLower(
      file_name.size() >= 4 ? file_name.substr(file_name.size() - 4)
                            : file_name);
  if (extension == ".obj") {
    // Wavefront OBJ file format.
    ObjDecoder obj_decoder;
    const Status obj_status = obj_decoder.DecodeFromFile(file_name, pc.get());
    if (!obj_status.ok()) {
      return obj_status;
    }
    return std::move(pc);
  }
  if (extension == ".ply") {
    // Wavefront PLY file format.
    PlyDecoder ply_decoder;
    DRACO_RETURN_IF_ERROR(ply_decoder.DecodeFromFile(file_name, pc.get()));
    return std::move(pc);
  }

  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer decoder_buffer;
  decoder_buffer.Init(buffer.data(), buffer.size());
  Decoder decoder;
  auto status_or = decoder.DecodePointCloudFromBuffer(&decoder_buffer);
  return std::move(status_or).value();
}